

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  sqlite3 *db;
  sqlite3_context *pCtx;
  int iVar4;
  uint uVar5;
  RenameToken *pToken_1;
  char *pcVar6;
  char *zName;
  char *pcVar7;
  i64 iVar8;
  RenameToken *pRVar9;
  TriggerStep *pTVar10;
  RenameToken *pToken_2;
  FKey *pFVar11;
  int iVar12;
  long lVar13;
  RenameToken **ppRVar14;
  RenameToken *pRVar15;
  RenameToken *pToken_4;
  RenameToken *pRVar16;
  SrcList *pSVar17;
  RenameToken *pToken;
  long lVar18;
  RenameToken *pRVar19;
  RenameCtx sCtx;
  Walker sWalker;
  Parse sParse;
  NameContext sNC;
  RenameCtx local_288;
  sqlite3_context *local_268;
  sqlite3_value **local_260;
  char *local_258;
  sqlite3_xauth local_250;
  char *local_248;
  char *local_240;
  Walker local_238;
  Parse local_208;
  NameContext local_68;
  
  db = context->pOut->db;
  local_240 = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar6 = (char *)sqlite3ValueText(argv[3],'\x01');
  zName = (char *)sqlite3ValueText(argv[4],'\x01');
  pcVar7 = (char *)sqlite3ValueText(argv[5],'\x01');
  local_260 = argv;
  iVar8 = sqlite3VdbeIntValue(argv[6]);
  if (pcVar7 == (char *)0x0 || (zName == (char *)0x0 || pcVar6 == (char *)0x0)) {
    return;
  }
  local_250 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  local_268 = context;
  local_258 = pcVar6;
  local_248 = pcVar7;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  pcVar6 = local_240;
  local_288.pTab = (Table *)0x0;
  local_288.zOld = (char *)0x0;
  local_288.pList = (RenameToken *)0x0;
  local_288.nList = 0;
  local_288.iCol = 0;
  local_288.pTab = sqlite3FindTable(db,zName,local_240);
  local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_238.walkerDepth = 0;
  local_238.eCode = 0;
  local_238._38_2_ = 0;
  local_238.xExprCallback = renameTableExprCb;
  local_238.xSelectCallback = renameTableSelectCb;
  local_238.pParse = &local_208;
  local_238.u.pNC = (NameContext *)&local_288;
  iVar4 = renameParseSql(&local_208,pcVar6,db,local_258,(int)iVar8);
  pCtx = local_268;
  if (iVar4 != 0) goto LAB_001b8eec;
  uVar5 = (uint)db->flags;
  if (local_208.pNewTable != (Table *)0x0) {
    if ((local_208.pNewTable)->eTabType == '\x02') {
      iVar4 = 0;
      if ((uVar5 >> 0x1a & 1) == 0) {
        local_68.pSrcList = (SrcList *)0x0;
        local_68.nRef = 0;
        local_68.nNcErr = 0;
        local_68.ncFlags = 0;
        local_68._44_4_ = 0;
        local_68.uNC.pEList = (ExprList *)0x0;
        local_68.pNext = (NameContext *)0x0;
        local_68.pWinSelect = (Select *)0x0;
        pbVar1 = (byte *)((long)&(((local_208.pNewTable)->u).view.pSelect)->selFlags + 2);
        *pbVar1 = *pbVar1 & 0xdf;
        local_68.pParse = &local_208;
        sqlite3SelectPrep(&local_208,((local_208.pNewTable)->u).view.pSelect,&local_68);
        iVar4 = local_208.rc;
        if (local_208.nErr == 0) {
          sqlite3WalkSelect(&local_238,((local_208.pNewTable)->u).view.pSelect);
          iVar4 = 0;
        }
      }
    }
    else {
      if (((((byte)(db->flags >> 0x1a) & 0x3f & (uVar5 >> 0xe & 1) == 0) == 0) &&
          ((local_208.pNewTable)->eTabType != '\x01')) &&
         (pFVar11 = ((local_208.pNewTable)->u).tab.pFKey, pFVar11 != (FKey *)0x0)) {
        pRVar9 = local_288.pList;
        iVar4 = local_288.nList;
LAB_001b90fb:
        pcVar6 = pFVar11->zTo;
        if (pcVar6 != (char *)0x0) {
          lVar13 = 0;
          do {
            bVar2 = pcVar6[lVar13];
            if (bVar2 == zName[lVar13]) {
              if ((ulong)bVar2 == 0) goto LAB_001b9131;
            }
            else if (""[bVar2] != ""[(byte)zName[lVar13]]) break;
            lVar13 = lVar13 + 1;
          } while( true );
        }
        goto LAB_001b918d;
      }
LAB_001b919a:
      if ((local_208.pNewTable)->zName != (char *)0x0) {
        lVar13 = 0;
        do {
          bVar2 = zName[lVar13];
          bVar3 = (local_208.pNewTable)->zName[lVar13];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_001b9222;
          }
          else if (""[bVar2] != ""[bVar3]) break;
          lVar13 = lVar13 + 1;
        } while( true );
      }
      iVar4 = 0;
    }
    goto LAB_001b8eec;
  }
  if (local_208.pNewIndex != (Index *)0x0) {
    pcVar6 = (local_208.pNewIndex)->zName;
    if (local_208.pRename != (RenameToken *)0x0 && pcVar6 != (char *)0x0) {
      if ((char *)(local_208.pRename)->p == pcVar6) {
        ppRVar14 = &local_208.pRename;
        pRVar9 = local_208.pRename;
      }
      else {
        do {
          pRVar9 = local_208.pRename;
          local_208.pRename = pRVar9->pNext;
          if (local_208.pRename == (RenameToken *)0x0) goto LAB_001b92b8;
        } while ((char *)(local_208.pRename)->p != pcVar6);
        ppRVar14 = &pRVar9->pNext;
        pRVar9 = local_208.pRename;
      }
      *ppRVar14 = pRVar9->pNext;
      pRVar9->pNext = local_288.pList;
      local_288.nList = local_288.nList + 1;
      local_288.pList = pRVar9;
    }
LAB_001b92b8:
    iVar4 = 0;
    if (((uVar5 >> 0x1a & 1) == 0) && ((local_208.pNewIndex)->pPartIdxWhere != (Expr *)0x0)) {
      walkExpr(&local_238,(local_208.pNewIndex)->pPartIdxWhere);
    }
    goto LAB_001b8eec;
  }
  pcVar6 = (local_208.pNewTrigger)->table;
  if (pcVar6 != (char *)0x0) {
    lVar13 = 0;
    do {
      bVar2 = pcVar6[lVar13];
      if (bVar2 == zName[lVar13]) {
        if ((ulong)bVar2 == 0) goto LAB_001b92e9;
      }
      else if (""[bVar2] != ""[(byte)zName[lVar13]]) break;
      lVar13 = lVar13 + 1;
    } while( true );
  }
  goto LAB_001b9372;
LAB_001b93fe:
  if (local_208.pRename != (RenameToken *)0x0 && bVar2 == bVar3) {
    pRVar19 = local_208.pRename;
    pRVar15 = local_208.pRename;
    ppRVar14 = &local_208.pRename;
    if ((char *)(local_208.pRename)->p != pcVar6) {
      do {
        pRVar16 = pRVar19;
        pRVar19 = pRVar16->pNext;
        pRVar15 = pRVar9;
        if (pRVar19 == (RenameToken *)0x0) goto LAB_001b944e;
      } while ((char *)pRVar19->p != pcVar6);
      ppRVar14 = &pRVar16->pNext;
      pRVar15 = pRVar19;
    }
    *ppRVar14 = pRVar15->pNext;
    pRVar15->pNext = pRVar9;
    iVar12 = iVar12 + 1;
    local_288.nList = iVar12;
    local_288.pList = pRVar15;
  }
LAB_001b944e:
  if ((pTVar10->pFrom != (SrcList *)0x0) && (pSVar17 = pTVar10->pFrom, 0 < pSVar17->nSrc)) {
    lVar13 = 0;
LAB_001b946a:
    pcVar6 = pSVar17->a[lVar13].zName;
    if (pcVar6 != (char *)0x0) {
      lVar18 = 0;
      do {
        bVar2 = pcVar6[lVar18];
        if (bVar2 == zName[lVar18]) {
          if ((ulong)bVar2 == 0) goto LAB_001b94a1;
        }
        else if (""[bVar2] != ""[(byte)zName[lVar18]]) break;
        lVar18 = lVar18 + 1;
      } while( true );
    }
    goto LAB_001b94f1;
  }
LAB_001b9504:
  pTVar10 = pTVar10->pNext;
  pRVar9 = pRVar15;
  iVar4 = 0;
  if (pTVar10 == (TriggerStep *)0x0) goto LAB_001b8eec;
  goto LAB_001b93cc;
LAB_001b94a1:
  if (local_208.pRename != (RenameToken *)0x0 && pcVar6 != (char *)0x0) {
    pRVar9 = local_208.pRename;
    ppRVar14 = &local_208.pRename;
    if ((char *)(local_208.pRename)->p != pcVar6) {
      do {
        pRVar19 = pRVar9;
        pRVar9 = pRVar19->pNext;
        if (pRVar9 == (RenameToken *)0x0) goto LAB_001b94f1;
      } while ((char *)pRVar9->p != pcVar6);
      ppRVar14 = &pRVar19->pNext;
    }
    *ppRVar14 = pRVar9->pNext;
    pRVar9->pNext = pRVar15;
    iVar12 = iVar12 + 1;
    local_288.nList = iVar12;
    pRVar15 = pRVar9;
    local_288.pList = pRVar9;
  }
LAB_001b94f1:
  lVar13 = lVar13 + 1;
  pSVar17 = pTVar10->pFrom;
  if (pSVar17->nSrc <= lVar13) goto LAB_001b9504;
  goto LAB_001b946a;
LAB_001b9131:
  if (local_208.pRename != (RenameToken *)0x0 && pcVar6 != (char *)0x0) {
    pRVar15 = local_208.pRename;
    ppRVar14 = &local_208.pRename;
    if ((char *)(local_208.pRename)->p != pcVar6) {
      do {
        pRVar19 = pRVar15;
        pRVar15 = pRVar19->pNext;
        if (pRVar15 == (RenameToken *)0x0) goto LAB_001b918d;
      } while ((char *)pRVar15->p != pcVar6);
      ppRVar14 = &pRVar19->pNext;
    }
    *ppRVar14 = pRVar15->pNext;
    pRVar15->pNext = pRVar9;
    iVar4 = iVar4 + 1;
    local_288.nList = iVar4;
    pRVar9 = pRVar15;
    local_288.pList = pRVar15;
  }
LAB_001b918d:
  pFVar11 = pFVar11->pNextFrom;
  if (pFVar11 == (FKey *)0x0) goto LAB_001b919a;
  goto LAB_001b90fb;
LAB_001b9222:
  local_288.pTab = local_208.pNewTable;
  if ((uVar5 >> 0x1a & 1) == 0) {
    sqlite3WalkExprList(&local_238,(local_208.pNewTable)->pCheck);
  }
  pcVar6 = (local_208.pNewTable)->zName;
  iVar4 = 0;
  if (local_208.pRename != (RenameToken *)0x0 && pcVar6 != (char *)0x0) {
    if ((char *)(local_208.pRename)->p == pcVar6) {
      ppRVar14 = &local_208.pRename;
      pRVar9 = local_208.pRename;
    }
    else {
      do {
        pRVar9 = local_208.pRename;
        local_208.pRename = pRVar9->pNext;
        if (local_208.pRename == (RenameToken *)0x0) goto LAB_001b8eec;
      } while ((char *)(local_208.pRename)->p != pcVar6);
      ppRVar14 = &pRVar9->pNext;
      pRVar9 = local_208.pRename;
    }
    *ppRVar14 = pRVar9->pNext;
    pRVar9->pNext = local_288.pList;
    local_288.nList = local_288.nList + 1;
    local_288.pList = pRVar9;
  }
  goto LAB_001b8eec;
LAB_001b92e9:
  if (((local_288.pTab)->pSchema == (local_208.pNewTrigger)->pTabSchema) &&
     (local_208.pRename != (RenameToken *)0x0 && pcVar6 != (char *)0x0)) {
    pRVar9 = local_208.pRename;
    if ((char *)(local_208.pRename)->p == pcVar6) {
      ppRVar14 = &local_208.pRename;
    }
    else {
      do {
        pRVar15 = pRVar9;
        pRVar9 = pRVar15->pNext;
        if (pRVar9 == (RenameToken *)0x0) goto LAB_001b9372;
      } while ((char *)pRVar9->p != pcVar6);
      ppRVar14 = &pRVar15->pNext;
    }
    *ppRVar14 = pRVar9->pNext;
    pRVar9->pNext = local_288.pList;
    local_288.nList = local_288.nList + 1;
    local_288.pList = pRVar9;
  }
LAB_001b9372:
  iVar4 = 0;
  if (((uVar5 >> 0x1a & 1) == 0) && (iVar4 = renameResolveTrigger(&local_208), iVar4 == 0)) {
    renameWalkTrigger(&local_238,local_208.pNewTrigger);
    pTVar10 = (local_208.pNewTrigger)->step_list;
    iVar4 = 0;
    if (pTVar10 != (TriggerStep *)0x0) {
      pRVar9 = local_288.pList;
      iVar12 = local_288.nList;
LAB_001b93cc:
      pcVar6 = pTVar10->zTarget;
      pRVar15 = pRVar9;
      if (pcVar6 != (char *)0x0) {
        lVar13 = 0;
        do {
          bVar2 = pcVar6[lVar13];
          bVar3 = zName[lVar13];
          if (bVar2 == bVar3) {
            if ((ulong)bVar2 == 0) goto LAB_001b93fe;
          }
          else if (""[bVar2] != ""[bVar3]) goto LAB_001b93fe;
          lVar13 = lVar13 + 1;
        } while( true );
      }
      goto LAB_001b944e;
    }
  }
LAB_001b8eec:
  if (iVar4 == 0) {
    iVar4 = renameEditSql(pCtx,&local_288,local_258,local_248,1);
  }
  if (iVar4 != 0) {
    if ((iVar4 == 1) && ((db->flags & 0x10000001) == 1)) {
      sqlite3_result_value(pCtx,local_260[3]);
    }
    else if (local_208.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(pCtx,iVar4);
    }
    else {
      renameColumnParseError(pCtx,"",local_260[1],local_260[2],&local_208);
    }
  }
  renameParseCleanup(&local_208);
  pRVar9 = local_288.pList;
  while (pRVar9 != (RenameToken *)0x0) {
    pRVar15 = pRVar9->pNext;
    sqlite3DbFreeNN(db,pRVar9);
    pRVar9 = pRVar15;
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  db->xAuth = local_250;
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( IsView(pTab) ){
          if( isLegacy==0 ){
            Select *pSelect = pTab->u.view.pSelect;
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            assert( pSelect->selFlags & SF_View );
            pSelect->selFlags &= ~SF_View;
            sqlite3SelectPrep(&sParse, pTab->u.view.pSelect, &sNC);
            if( sParse.nErr ){
              rc = sParse.rc;
            }else{
              sqlite3WalkSelect(&sWalker, pTab->u.view.pSelect);
            }
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( (isLegacy==0 || (db->flags & SQLITE_ForeignKeys))
           && !IsVirtual(pTab)
          ){
            FKey *pFKey;
            assert( IsOrdinaryTable(pTab) );
            for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld)
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
              if( pStep->pFrom ){
                int i;
                for(i=0; i<pStep->pFrom->nSrc; i++){
                  SrcItem *pItem = &pStep->pFrom->a[i];
                  if( 0==sqlite3_stricmp(pItem->zName, zOld) ){
                    renameTokenFind(&sParse, &sCtx, pItem->zName);
                  }
                }
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
        sqlite3_result_value(context, argv[3]);
      }else if( sParse.zErrMsg ){
        renameColumnParseError(context, "", argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}